

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_new_points.cpp
# Opt level: O3

void am_new_points_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,
               Am_Object *new_obj_proto,Am_Value *new_loc)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Wrapper *pAVar6;
  Am_Object *this;
  Am_Object new_object;
  Am_Object orig_object;
  Am_Object owner;
  Am_Object impl_parent;
  Am_Object inter;
  Am_Inter_Location data;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  local_60.data = (Am_Object_Data *)0x0;
  local_80.data = (Am_Object_Data *)0x0;
  local_70.data = (Am_Object_Data *)0x0;
  pAVar5 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_60,pAVar5);
  pAVar5 = Am_Object::Get(command_obj,0x169,0);
  Am_Object::operator=(&local_80,pAVar5);
  pAVar5 = Am_Object::Get(command_obj,0x16f,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
  if (bVar1) {
    bVar2 = Am_Object::Valid(&local_80);
    bVar3 = true;
    if (bVar2) {
      pAVar5 = Am_Object::Get(command_obj,0x171,0);
      Am_Object::operator=(&local_70,pAVar5);
      bVar2 = Am_Object::Valid(&local_70);
      if (bVar2) {
        this = &local_38;
        Am_Object::Am_Object(this,&local_80);
        Am_Object::Add_Part(&local_70,this,true,0);
LAB_001bd519:
        Am_Object::~Am_Object(this);
        bVar3 = bVar1;
      }
    }
  }
  else {
    if (undo) {
      bVar3 = Am_Object::Valid(&local_80);
      if (bVar3) {
        Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_80,10);
        Am_Object::operator=(&local_70,&local_78);
        Am_Object::~Am_Object(&local_78);
        pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70);
        Am_Object::Set(command_obj,0x171,pAVar6,1);
        this = &local_40;
        Am_Object::Am_Object(this,&local_80);
        Am_Object::Remove_Part(&local_70,this);
        goto LAB_001bd519;
      }
    }
    else {
      bVar1 = Am_Object::Valid(&local_60);
      if (bVar1) {
        local_78.data = (Am_Object_Data *)0x0;
        local_68.data = (Am_Object_Data *)0x0;
        if ((reload_data) && (bVar1 = Am_Object::Valid(new_obj_proto), bVar1)) {
          Am_Object::operator=(&local_78,new_obj_proto);
          pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_78);
          Am_Object::Set(command_obj,0x11a,pAVar6,1);
        }
        else {
          pAVar5 = Am_Object::Get(command_obj,0x11a,0);
          Am_Object::operator=(&local_78,pAVar5);
        }
        bVar1 = Am_Object::Valid(&local_78);
        if (bVar1) {
          Am_Inter_Location::Am_Inter_Location((Am_Inter_Location *)&local_58,&local_78);
          if ((reload_data) && (bVar1 = Am_Value::Valid(new_loc), bVar1)) {
            Am_Inter_Location::operator=((Am_Inter_Location *)&local_58,new_loc);
          }
          pAVar5 = Am_Object::Get(command_obj,0xdf,0);
          iVar4 = Am_Value::operator_cast_to_int(pAVar5);
          if (iVar4 < 2) {
LAB_001bd6bb:
            am_create_new_object
                      (&local_50,&local_60,(Am_Inter_Location *)command_obj,&local_58,
                       SUB81(&local_78,0));
            Am_Object::operator=(&local_80,&local_50);
            Am_Object::~Am_Object(&local_50);
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
            Am_Object::Set(command_obj,0x169,pAVar6,0);
            pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
            Am_Object::Set(command_obj,0x16d,pAVar6,0);
            pAVar5 = Am_Object::Get(command_obj,0x154,0);
            Am_Object::operator=(&local_68,pAVar5);
            bVar3 = Am_Object::Valid(&local_68);
            bVar1 = true;
            if (bVar3) {
              pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
              Am_Object::Set(&local_68,0x169,pAVar6,0);
              pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
              Am_Object::Set(&local_68,0x16d,pAVar6,0);
            }
          }
          else {
            pAVar5 = Am_Object::Get(&local_60,0xd3,0);
            bVar1 = Am_Value::operator_cast_to_bool(pAVar5);
            if ((!bVar1) ||
               (bVar1 = Am_Inter_Location::Is_Zero_Size((Am_Inter_Location *)&local_58), !bVar1))
            goto LAB_001bd6bb;
            Am_Object::Set(command_obj,0x166,true,1);
            Am_Object::Am_Object(&local_48,&Am_No_Object);
            Am_Beep(&local_48);
            Am_Object::~Am_Object(&local_48);
            bVar1 = false;
          }
          Am_Inter_Location::~Am_Inter_Location((Am_Inter_Location *)&local_58);
          bVar3 = bVar1;
        }
        else {
          bVar1 = true;
          bVar3 = false;
        }
        Am_Object::~Am_Object(&local_68);
        Am_Object::~Am_Object(&local_78);
        if (bVar1 == false) goto LAB_001bd59c;
        goto LAB_001bd585;
      }
    }
    bVar3 = false;
  }
LAB_001bd585:
  Am_Object::Set(command_obj,0x16f,(bool)(bVar3 ^ 1),0);
LAB_001bd59c:
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

void
am_new_points_general_undo_redo(Am_Object command_obj, bool undo,
                                bool selective, bool reload_data,
                                Am_Object new_obj_proto,
                                const Am_Value &new_loc)
{
  Am_Object inter, new_object, owner;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  new_object = command_obj.Get(Am_VALUE);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Repeat";
    std::cout << " command " << command_obj << " on obj " << new_object
              << std::endl
              << std::flush;
  }
#endif

  //assume created object is always on top, so OK to undo it to the top
  bool currently_undone = command_obj.Get(Am_HAS_BEEN_UNDONE);
  if (currently_undone) {
    if (new_object.Valid()) {
      //then put it back
      owner = command_obj.Get(Am_SAVED_OLD_OBJECT_OWNER);
      if (owner.Valid()) {
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Adding " << new_object << " back to owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Add_Part(new_object);
      }
    }
  } else {
    if (undo) {
      if (new_object.Valid()) {
        // remove it
        owner = new_object.Get_Owner();
        command_obj.Set(Am_SAVED_OLD_OBJECT_OWNER, owner, Am_OK_IF_NOT_THERE);
#ifdef DEBUG
        if (inter.Valid() && Am_Inter_Tracing(inter))
          std::cout << "++Removing " << new_object << " from owner " << owner
                    << std::endl
                    << std::flush;
#endif
        owner.Remove_Part(new_object);
      }
    } else { // selective repeat, create a new object
      if (inter.Valid()) {
        Am_Object orig_object, impl_parent;
        if (reload_data && new_obj_proto.Valid()) {
          orig_object = new_obj_proto;
          command_obj.Set(Am_START_OBJECT, orig_object, Am_OK_IF_NOT_THERE);
        } else
          orig_object = command_obj.Get(Am_START_OBJECT);
        if (orig_object.Valid()) {
          // command_obj.Get(Am_INTERIM_VALUE);
          Am_Inter_Location data(orig_object);
          bool override = false;
          if (reload_data && new_loc.Valid()) {
            data = new_loc;
            override = true;
          }
          //if only one point, then size doesn't matter
          if ((int)command_obj.Get(Am_HOW_MANY_POINTS) >= 2) {
            bool beep_on_abort = inter.Get(Am_INTER_BEEP_ON_ABORT);
            if (beep_on_abort && data.Is_Zero_Size()) {
              Am_INTER_TRACE_PRINT(inter, "Aborting " << command_obj
                                                      << " because zero size");
              //not queued for undo
              command_obj.Set(Am_COMMAND_IS_ABORTING, true, Am_OK_IF_NOT_THERE);
              Am_Beep();
              return;
            }
          }
          new_object = am_create_new_object(inter, command_obj, data,
                                            orig_object, override);
          Am_INTER_TRACE_PRINT(inter, "++Created new object " << new_object
                                                              << " at location "
                                                              << data);
          command_obj.Set(Am_VALUE, new_object);
          command_obj.Set(Am_OBJECT_MODIFIED, new_object);
          impl_parent = command_obj.Get(Am_IMPLEMENTATION_PARENT);
          if (impl_parent.Valid()) {
            impl_parent.Set(Am_VALUE, new_object);
            impl_parent.Set(Am_OBJECT_MODIFIED, new_object);
          }
          currently_undone = true; //so set below will make it false
        }
      }
    }
  }
  command_obj.Set(Am_HAS_BEEN_UNDONE, !currently_undone);
}